

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

Vec_Ptr_t * Llb_ManComputeCutLi(Aig_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  
  if (p->nTruePos != 0) {
    __assert_fail("Saig_ManPoNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                  ,0x44e,"Vec_Ptr_t *Llb_ManComputeCutLi(Aig_Man_t *)");
  }
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  Aig_ManIncrementTravId(p);
  if (0 < p->nRegs) {
    iVar5 = 0;
    do {
      uVar2 = p->nTruePos + iVar5;
      if (((int)uVar2 < 0) || (p->vCos->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar7 = (void *)(*(ulong *)((long)p->vCos->pArray[uVar2] + 8) & 0xfffffffffffffffe);
      if (((*(uint *)((long)pvVar7 + 0x18) & 7) != 1) &&
         (*(int *)((long)pvVar7 + 0x20) != p->nTravIds)) {
        *(int *)((long)pvVar7 + 0x20) = p->nTravIds;
        uVar2 = pVVar3->nSize;
        uVar1 = pVVar3->nCap;
        if (uVar2 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
            }
            iVar6 = 0x10;
          }
          else {
            iVar6 = uVar1 * 2;
            if (iVar6 <= (int)uVar1) goto LAB_0082398a;
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
            }
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = iVar6;
        }
LAB_0082398a:
        pVVar3->nSize = uVar2 + 1;
        pVVar3->pArray[(int)uVar2] = pvVar7;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < p->nRegs);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCutLi( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    assert( Saig_ManPoNum(p) == 0 );
    vMinCut = Vec_PtrAlloc( 100 );
    Aig_ManIncrementTravId(p);
    Saig_ManForEachLi( p, pObj, i )
    {
        pObj = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsConst1(pObj) )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        Aig_ObjSetTravIdCurrent(p, pObj);
        Vec_PtrPush( vMinCut, pObj );
    }
    return vMinCut;
}